

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O2

int lrzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  ssize_t in_RAX;
  int *piVar2;
  ssize_t avail;
  
  avail = in_RAX;
  piVar2 = (int *)__archive_read_filter_ahead(filter,6,&avail);
  iVar1 = 0;
  if ((((piVar2 != (int *)0x0) && (avail != 0)) && (*piVar2 == 0x495a524c)) &&
     ((char)piVar2[1] == '\0')) {
    iVar1 = 6;
    if ((byte)(*(char *)((long)piVar2 + 5) - 0xbU) < 0xfb) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
lrzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail, len;
	int i;

	(void)self; /* UNUSED */
	/* Start by looking at the first six bytes of the header, which
	 * is all fixed layout. */
	len = 6;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LRZIP_HEADER_MAGIC, LRZIP_HEADER_MAGIC_LEN))
		return (0);

	/* current major version is always 0, verify this */
	if (p[LRZIP_HEADER_MAGIC_LEN])
		return 0;
	/* support only v0.6+ lrzip for sanity */
	i = p[LRZIP_HEADER_MAGIC_LEN + 1];
	if ((i < 6) || (i > 10))
		return 0;

	return (int)len;
}